

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_postfix_expr(gvisitor_t *self,gnode_postfix_expr_t *node)

{
  ulong uVar1;
  _Bool _Var2;
  gnode_n gVar3;
  gravity_function_t *f;
  ircode_t *code;
  gnode_t *pgVar4;
  gravity_vm *pgVar5;
  opcode_t op;
  _Bool _Var6;
  uint16_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t p1;
  uint32_t p1_00;
  gravity_class_t *pgVar11;
  ulong uVar12;
  void *pvVar13;
  gnode_postfix_expr_t *node_00;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  gnode_identifier_expr_t *identifier;
  ulong uVar19;
  gnode_r *pgVar20;
  gnode_postfix_expr_t *pgVar21;
  byte bVar22;
  uint16_t i;
  ushort uVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  gravity_value_t gVar27;
  uint32_t *local_98;
  ulong local_88;
  long local_80;
  ulong local_58;
  
  if (node->list == (gnode_r *)0x0) {
    gvisit(self,node->id);
    return;
  }
  f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((f == (gravity_function_t *)0x0) || (f->isa != gravity_class_function)) {
    pcVar14 = "Invalid code context.";
    node_00 = node;
    goto LAB_00138ca7;
  }
  code = *(ircode_t **)((long)&f->field_9 + 0x50);
  ircode_push_context(code);
  bVar25 = false;
  ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,0,(node->base).token.lineno);
  gvisit(self,node->id);
  pgVar4 = node->id;
  if (pgVar4 != (gnode_t *)0x0) {
    if (pgVar4->tag == NODE_KEYWORD_EXPR) {
      bVar25 = (pgVar4->token).type == TOK_KEY_SUPER;
    }
    else {
      bVar25 = false;
    }
  }
  uVar8 = ircode_register_pop_context_protect(code,true);
  node_00 = (gnode_postfix_expr_t *)node->id;
  if (uVar8 == 0xffffffff) {
    pcVar14 = "Invalid postfix expression.";
    goto LAB_00138ca7;
  }
  pgVar20 = node->list;
  if (node_00 != (gnode_postfix_expr_t *)0x0) {
    gVar3 = (node_00->base).tag;
    if (gVar3 == NODE_KEYWORD_EXPR) {
      if ((node_00->base).token.type == TOK_KEY_SUPER) goto LAB_00138e2e;
    }
    else if ((((gVar3 == NODE_IDENTIFIER_EXPR) && (node_00[1].base.block_length == 3)) &&
             (*(short *)&node_00[1].base.field_0xe == 0)) &&
            (*(short *)&node_00[1].base.field_0xc == -1)) {
LAB_00138e2e:
      uVar10 = 0;
      goto LAB_00138ed2;
    }
  }
  if (((pgVar20 == (gnode_r *)0x0) || (pgVar20->n == 0)) || (*pgVar20->p == (gnode_t *)0x0)) {
    bVar26 = false;
  }
  else {
    bVar26 = (*pgVar20->p)->tag == NODE_ACCESS_EXPR;
  }
  uVar10 = uVar8;
  if (node_00 == (gnode_postfix_expr_t *)0x0) goto LAB_00138ed2;
  gVar3 = (node_00->base).tag;
  if (gVar3 == NODE_IDENTIFIER_EXPR) {
    if (node_00[1].base.block_length == 4 && !bVar26) {
      uVar9 = ircode_register_push_temp(code);
      uVar10 = 0;
      for (uVar23 = 0; uVar23 < *(ushort *)&node_00[1].base.field_0xe; uVar23 = uVar23 + 1) {
        ircode_add(code,LOAD,uVar9,uVar10,0x100,(node_00->base).token.lineno);
        uVar10 = uVar9;
      }
      uVar10 = ircode_register_pop_context_protect(code,true);
      if (uVar10 == 0xffffffff) {
        pcVar14 = "Unexpected register error.";
LAB_00138ca7:
        report_error(self,&node_00->base,pcVar14);
        return;
      }
      pgVar20 = node->list;
      goto LAB_00138ed2;
    }
    node_00 = *(gnode_postfix_expr_t **)&node_00[1].base;
    if (node_00 == (gnode_postfix_expr_t *)0x0) goto LAB_00138ed2;
    gVar3 = (node_00->base).tag;
  }
  uVar9 = 0;
  if (gVar3 == NODE_VARIABLE) {
    pgVar21 = *(gnode_postfix_expr_t **)&node_00[1].base.block_length;
    if (pgVar21 == (gnode_postfix_expr_t *)0x0) goto LAB_00138ed2;
    uVar9 = (uint32_t)(ushort)node_00[1].base.token.lineno;
    gVar3 = (pgVar21->base).tag;
    node_00 = pgVar21;
  }
  if (((gVar3 == NODE_FUNCTION_DECL) &&
      (*(char *)((long)&node_00[1].base.token.length + 1) == '\x01')) &&
     ((uVar10 = uVar9, !bVar26 &&
      (pgVar11 = context_get_class(self), uVar10 = uVar8, pgVar11 != (gravity_class_t *)0x0)))) {
    uVar10 = 0;
  }
LAB_00138ed2:
  local_98 = (uint32_t *)malloc(0x20);
  *local_98 = uVar10;
  if (pgVar20 == (gnode_r *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = pgVar20->n;
  }
  _Var2 = (node->base).is_assignment;
  lVar17 = 1;
  uVar15 = 0;
  local_80 = 8;
  do {
    uVar10 = uVar8;
LAB_00138f1d:
    do {
      if (uVar16 == uVar15) {
        free(local_98);
        ircode_pop_context(code);
        uVar8 = ircode_register_first_temp_available(code);
        if (uVar8 < uVar10) {
          ircode_register_pop(code);
          uVar8 = ircode_register_push_temp(code);
          ircode_add(code,MOVE,uVar8,uVar10,0,(node->base).token.lineno);
          ircode_register_clear(code,uVar10);
        }
        ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,(node->base).token.lineno);
        return;
      }
      if (uVar15 < node->list->n) {
        node_00 = (gnode_postfix_expr_t *)node->list->p[uVar15];
      }
      else {
        node_00 = (gnode_postfix_expr_t *)0x0;
      }
      gVar3 = (node_00->base).tag;
      uVar15 = uVar15 + 1;
      if (gVar3 == NODE_ACCESS_EXPR) {
        node_00 = (gnode_postfix_expr_t *)node_00->id;
        pgVar5 = *(gravity_vm **)((long)self->data + 0x38);
        gVar27 = gravity_string_to_value((gravity_vm *)0x0,(char *)node_00->id,0xffffffff);
        uVar7 = gravity_function_cpool_add(pgVar5,f,gVar27);
        uVar9 = ircode_register_push_temp(code);
        ircode_add(code,LOADK,uVar9,(uint)uVar7,0,(node_00->base).token.lineno);
        uVar8 = ircode_register_pop(code);
        if (uVar8 != 0xffffffff) {
          bVar22 = uVar16 == uVar15 & _Var2;
          if (bVar22 == 0) {
            uVar8 = ircode_register_push_temp(code);
          }
          else {
            uVar8 = ircode_register_pop(code);
          }
          if (uVar8 != 0xffffffff) {
            if (bVar25) {
              pgVar11 = context_get_class(self);
              if (pgVar11 == (gravity_class_t *)0x0) {
                pcVar14 = "Unable to use super keyword in a non class context.";
                node_00 = node;
                goto LAB_00138ca7;
              }
              pcVar14 = pgVar11->superlook;
              pvVar13 = self->data;
              if (pcVar14 == (char *)0x0) {
                lVar18 = 0;
                do {
                  if (*(long *)((long)pvVar13 + 0x18) == lVar18) goto LAB_001391bd;
                  lVar24 = *(long *)(*(long *)((long)pvVar13 + 0x28) + lVar18 * 8);
                  lVar18 = lVar18 + 1;
                } while (*(gravity_class_t **)(lVar24 + 0x90) != pgVar11);
                lVar18 = *(long *)(lVar24 + 0x68);
                if ((lVar18 == 0) || (pcVar14 = *(char **)(lVar18 + 0x60), pcVar14 == (char *)0x0))
                {
LAB_001391bd:
                  pcVar14 = "Object";
                  if (pgVar11->superclass != (gravity_class_s *)0x0) {
                    pcVar14 = pgVar11->superclass->identifier;
                  }
                }
              }
              pgVar5 = *(gravity_vm **)((long)pvVar13 + 0x38);
              gVar27 = gravity_string_to_value((gravity_vm *)0x0,pcVar14,0xffffffff);
              uVar7 = gravity_function_cpool_add(pgVar5,f,gVar27);
              ircode_add_constant(code,(uint)uVar7,(node->base).token.lineno);
              uVar10 = ircode_register_pop(code);
              ircode_add(code,LOADS,uVar8,uVar10,uVar9,(node->base).token.lineno);
            }
            else {
              ircode_add(code,(uint)bVar22 * 8 + LOAD,uVar8,uVar10,uVar9,(node->base).token.lineno);
            }
            if (bVar22 == 0) {
              if (uVar15 < uVar16) {
                uVar10 = ircode_register_pop_context_protect(code,true);
                if (uVar10 == 0xffffffff) {
                  pcVar14 = "Unexpected register error.";
                  goto LAB_00138ca7;
                }
              }
              else {
                _Var6 = ircode_register_istemp(code,uVar8);
                if (_Var6) {
                  ircode_register_protect_outside_context(code,uVar8);
                }
              }
            }
            bVar25 = false;
            uVar10 = uVar8;
            if ((uVar16 != uVar15) && (bVar25 = false, node->list->p[uVar15]->tag != NODE_CALL_EXPR)
               ) {
              if (lVar17 == local_80) {
                local_80 = lVar17 * 2;
                if (lVar17 == 0) {
                  local_80 = 8;
                }
                local_98 = (uint32_t *)realloc(local_98,local_80 * 4);
              }
              local_98[lVar17] = uVar8;
              goto LAB_0013969e;
            }
            goto LAB_00138f1d;
          }
        }
        pcVar14 = "Invalid access expression.";
        goto LAB_00138ca7;
      }
      if (gVar3 != NODE_SUBSCRIPT_EXPR) {
        bVar25 = false;
        if (gVar3 != NODE_CALL_EXPR) goto LAB_00138f1d;
        _Var6 = ircode_register_istemp(code,uVar10);
        uVar8 = uVar10;
        if (!_Var6) {
          uVar8 = ircode_register_push_temp(code);
        }
        uVar9 = ircode_register_push_temp(code);
        ircode_add(code,MOVE,uVar9,uVar10,0,(node->base).token.lineno);
        uVar10 = ircode_register_pop_context_protect(code,true);
        if (uVar10 != 0xffffffff) {
          uVar10 = local_98[lVar17 + -1];
          p1 = ircode_register_push_temp(code);
          ircode_add(code,MOVE,p1,uVar10,0,(node->base).token.lineno);
          uVar10 = ircode_register_pop_context_protect(code,true);
          if (uVar10 != 0xffffffff) {
            pgVar4 = node_00->id;
            if (pgVar4 == (gnode_t *)0x0) {
              local_58 = 0;
            }
            else {
              local_58._0_4_ = pgVar4->tag;
              local_58._4_4_ = pgVar4->refcount;
            }
            local_88 = 0;
            pvVar13 = (void *)0x0;
            for (uVar19 = 0; uVar19 != local_58; uVar19 = uVar19 + 1) {
              pgVar4 = node_00->id;
              uVar1._0_4_ = pgVar4->tag;
              uVar1._4_4_ = pgVar4->refcount;
              if (uVar19 < uVar1) {
                pgVar21 = *(gnode_postfix_expr_t **)(*(long *)&pgVar4->token + uVar19 * 8);
              }
              else {
                pgVar21 = (gnode_postfix_expr_t *)0x0;
              }
              ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,(node->base).token.lineno);
              gvisit(self,&pgVar21->base);
              ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,0,(node->base).token.lineno);
              uVar10 = ircode_register_pop_context_protect(code,true);
              if (uVar10 == 0xffffffff) {
                report_error(self,&pgVar21->base,"Invalid argument expression at index %d.",
                             uVar19 + 1);
                return;
              }
              uVar12 = (ulong)uVar10;
              uVar1 = (ulong)uVar9 + 2 + uVar19;
              if (uVar1 != uVar12) {
                p1_00 = ircode_register_push_temp(code);
                if (p1_00 == 0) {
                  return;
                }
                ircode_add(code,MOVE,p1_00,uVar10,0,(node->base).token.lineno);
                ircode_register_clear(code,uVar10);
                uVar10 = ircode_register_pop_context_protect(code,true);
                if (uVar10 == 0xffffffff) {
                  pcVar14 = "Invalid argument expression";
                  node_00 = pgVar21;
                  goto LAB_00138ca7;
                }
                uVar12 = (ulong)uVar10;
              }
              if (uVar1 != uVar12) {
                pcVar14 = "Invalid register computation in call expression.";
                node_00 = pgVar21;
                goto LAB_00138ca7;
              }
              if (uVar19 == local_88) {
                local_88 = uVar19 * 2;
                if (uVar19 == 0) {
                  local_88 = 8;
                }
                pvVar13 = realloc(pvVar13,local_88 * 4);
              }
              *(uint32_t *)((long)pvVar13 + uVar19 * 4) = uVar10;
            }
            ircode_add(code,CALL,uVar8,uVar9,(int)local_58 + 1,(node->base).token.lineno);
            ircode_register_clear(code,uVar9);
            ircode_register_clear(code,p1);
            pgVar4 = node_00->id;
            if (pgVar4 == (gnode_t *)0x0) {
              lVar18 = 0;
            }
            else {
              lVar18._0_4_ = pgVar4->tag;
              lVar18._4_4_ = pgVar4->refcount;
            }
            for (lVar24 = 0; lVar18 != lVar24; lVar24 = lVar24 + 1) {
              ircode_register_clear(code,*(uint32_t *)((long)pvVar13 + lVar24 * 4));
            }
            if (lVar17 + -1 == local_80) {
              bVar25 = local_80 == 0;
              local_80 = local_80 * 2;
              if (bVar25) {
                local_80 = 8;
              }
              local_98 = (uint32_t *)realloc(local_98,local_80 * 4);
            }
            local_98[lVar17 + -1] = uVar8;
            if (uVar16 == uVar15) {
              uVar10 = ircode_register_count(code);
              if (uVar10 == 0) {
LAB_001395c2:
                ircode_register_push(code,uVar8);
              }
              else {
                uVar10 = ircode_register_last(code);
                if (uVar10 == 0xffffffff) {
                  pcVar14 = "Invalid call expression.";
                  goto LAB_00138ca7;
                }
                if (uVar10 != uVar8) goto LAB_001395c2;
              }
              _Var6 = ircode_register_protect_outside_context(code,uVar8);
              if (!_Var6) {
                pcVar14 = "Invalid register access.";
                goto LAB_00138ca7;
              }
            }
            free(pvVar13);
            bVar25 = false;
            uVar10 = uVar8;
            goto LAB_00138f1d;
          }
        }
        pcVar14 = "Unexpected register error.";
        goto LAB_00138ca7;
      }
      ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,(node->base).token.lineno);
      gvisit(self,node_00->id);
      ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,0,(node->base).token.lineno);
      uVar9 = ircode_register_pop(code);
      if (uVar9 == 0xffffffff) {
LAB_001397bb:
        pcVar14 = "Invalid subscript expression.";
        node_00 = (gnode_postfix_expr_t *)node_00->id;
        goto LAB_00138ca7;
      }
      bVar22 = uVar16 == uVar15 & _Var2;
      if (bVar22 == 0) {
        uVar8 = ircode_register_push_temp(code);
      }
      else {
        uVar8 = ircode_register_pop(code);
      }
      if (uVar8 == 0xffffffff) goto LAB_001397bb;
      op = LOADAT;
      if (bVar22 != 0) {
        op = STOREAT;
      }
      ircode_add(code,op,uVar8,uVar10,uVar9,(node->base).token.lineno);
      bVar25 = false;
      uVar10 = uVar8;
    } while (uVar16 <= uVar15);
    uVar10 = ircode_register_pop_context_protect(code,true);
    if (uVar10 == 0xffffffff) break;
    if (lVar17 == local_80) {
      local_80 = lVar17 * 2;
      if (lVar17 == 0) {
        local_80 = 8;
      }
      local_98 = (uint32_t *)realloc(local_98,local_80 * 4);
    }
    local_98[lVar17] = uVar10;
LAB_0013969e:
    lVar17 = lVar17 + 1;
    bVar25 = false;
  } while( true );
  pcVar14 = "Unexpected register error.";
  node_00 = (gnode_postfix_expr_t *)node_00->id;
  goto LAB_00138ca7;
}

Assistant:

static void visit_postfix_expr (gvisitor_t *self, gnode_postfix_expr_t *node) {
    DEBUG_CODEGEN("visit_postfix_expr");

    // node->list usually cannot be NULL, it is NULL only as a result of a static enum transformation (see semacheck2.c)
    if (node->list == NULL) {
        visit(node->id);
        return;
    }

    DECLARE_CODE();
    CODEGEN_COUNT_REGISTERS(n1);
    ircode_push_context(code);

    // disable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));

    // generate code for the common id node
    visit(node->id);

    bool is_super = IS_SUPER(node->id);

    // register that contains callable object
    uint32_t target_register = ircode_register_pop_context_protect(code, true);
    if (target_register == REGISTER_ERROR) {
        report_error(self, (gnode_t *)node->id, "Invalid postfix expression.");
        return;
    }

    // register where to store final result
    uint32_t dest_register = target_register;

    // mandatory self register (initialized to 0 in case of implicit self or explicit super)
    uint32_r self_list; marray_init(self_list);
    uint32_t first_self_register = compute_self_register(self, code, node->id, target_register, node->list);
    if (first_self_register == UINT32_MAX) return;
    marray_push(uint32_t, self_list, first_self_register);

    // process each subnode and set is_assignment flag
    bool is_assignment = node->base.is_assignment;
    size_t count = gnode_array_size(node->list);

    for (size_t i=0; i<count; ++i) {
        // a subnode can be a CALL_EXPR     => id.()
        // a NODE_ACCESS_EXPR               => id.id2
        // a NODE_SUBSCRIPT_EXPR            => id[]
        // or ANY combination of the them!  => id.id2.id3()[24]().id5()
        gnode_postfix_subexpr_t *subnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i);

        // identify postfix type: NODE_CALL_EXPR, NODE_ACCESS_EXPR, NODE_SUBSCRIPT_EXPR
        gnode_n tag = subnode->base.tag;

        // check assignment flag
        bool is_real_assigment = (is_assignment && IS_LAST_LOOP(i, count));

        if (tag == NODE_CALL_EXPR) {
            // a CALL instruction needs to properly prepare stack before execution
            // format is CALL A B C

            // where A is the destination register
            // B is the callable object
            // and C is the number of arguments passed to the CALL
            // arguments must be on the stack (so gravity VM can use a register window in order to speed up instruction)
            // and are expected to be starting from B+1

            // check dest register
            bool dest_is_temp = ircode_register_istemp(code, dest_register);
            if (!dest_is_temp) {
                dest_register = ircode_register_push_temp(code);
                dest_is_temp = true;
            }

            // add target register (must be temp)
            uint32_t temp_target_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_target_register, target_register, 0, LINE_NUMBER(node));
            uint32_t treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // always add SELF parameter (must be temp+1)
            uint32_t self_register = marray_pop(self_list);
            uint32_t temp_self_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_self_register, self_register, 0, LINE_NUMBER(node));
            treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // process each parameter (each must be temp+2 ... temp+n)
            marray_decl_init(uint32_r, args);
            size_t n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                // process each argument
                gnode_t *arg = (gnode_t *)gnode_array_get(subnode->args, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(arg);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                uint32_t nreg = ircode_register_pop_context_protect(code, true);
                if (nreg == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)arg, "Invalid argument expression at index %d.", j+1);
                    return;
                }

                // make sure args are in consecutive register locations (from temp_target_register + 1 to temp_target_register + n)
                if (nreg != temp_target_register + j + 2) {
                    uint32_t temp = ircode_register_push_temp(code);
                    if (temp == 0) return; // temp value == 0 means codegen error (error will be automatically reported later in visit_function_decl
					ircode_add(code, MOVE, temp, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    nreg = ircode_register_pop_context_protect(code, true);
                    if (nreg == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)arg, "Invalid argument expression");
                        return;
                    }
                }
                if (nreg != temp_target_register + j + 2) {
                    report_error(self, (gnode_t *)arg, "Invalid register computation in call expression.");
                    return;
                }
                
                // a checkpoint should be added after each nreg computation in order to support STRUCT
                // I'll skip this overhead in this version because it should be a type based decision
                // ircode_add_check(code, nreg);
                marray_push(uint32_t, args, nreg);
            }

            // generate instruction CALL with count parameters (taking in account self)
			ircode_add(code, CALL, dest_register, temp_target_register, (uint32_t)n+1, LINE_NUMBER(node));

            // cleanup temp registers
            ircode_register_clear(code, temp_target_register);
            ircode_register_clear(code, temp_self_register);
            n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                uint32_t reg = marray_get(args, j);
                ircode_register_clear(code, reg);
            }

            // update self list
            marray_push(uint32_t, self_list, dest_register);

            // a call returns a value
            if (IS_LAST_LOOP(i, count)) {
                if (ircode_register_count(code)) {
                    // code added in order to protect the extra register pushed in case
                    // of code like: f(20)(30)
                    uint32_t last_register = ircode_register_last(code);
                    if (last_register == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)subnode, "Invalid call expression.");
                        return;
                    }
                    if (dest_is_temp && last_register == dest_register) dest_is_temp = false;
                }
                if (dest_is_temp) ircode_register_push(code, dest_register);
                if (!ircode_register_protect_outside_context(code, dest_register)) {
                    report_error(self, (gnode_t *)subnode, "Invalid register access.");
                    return;
                }
            }

            // free temp args array
            marray_destroy(args);

        } else if (tag == NODE_ACCESS_EXPR) {
            // process identifier node (semantic check assures that each node is an identifier)
            gnode_identifier_expr_t *expr = (gnode_identifier_expr_t *)subnode->expr;
            uint32_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, expr->value));
            uint32_t index_register = ircode_register_push_temp(code);
			ircode_add(code, LOADK, index_register, index, 0, LINE_NUMBER(expr));
            uint32_t temp = ircode_register_pop(code);
            if (temp == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            // generate LOAD/STORE instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            if (is_super) {
                gravity_class_t *class = context_get_class(self);
                if (!class) {
                    report_error(self, (gnode_t *)node, "Unable to use super keyword in a non class context.");
                    return;
                }
                
                // check if class has a superclass not yet processed
                const char *identifier = lookup_superclass_identifier (self, class);
                if (!identifier) {
                    // it means that class superclass has already been processed
                    class = class->superclass;
                    identifier = (class) ? class->identifier : GRAVITY_CLASS_OBJECT_NAME;
                }
                
                uint32_t cpool_index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
                ircode_add_constant(code, cpool_index, LINE_NUMBER(node));
                uint32_t temp_reg = ircode_register_pop(code);
                ircode_add(code, LOADS, dest_register, temp_reg, index_register, LINE_NUMBER(node));
            } else {
                ircode_add(code, (is_real_assigment) ? STORE : LOAD, dest_register, target_register, index_register, LINE_NUMBER(node));
            }
            
            if (!is_real_assigment) {
                if (i+1<count) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)expr, "Unexpected register error.");
                    return;
                }
                } else {
                    // last loop
                    if (ircode_register_istemp(code, dest_register))
                        ircode_register_protect_outside_context(code, dest_register);
                }
            }

            // update self list (if latest instruction)
            // this was added in order to properly emit instructions for nested_class.gravity unit test
            if (!IS_LAST_LOOP(i, count)) {
                gnode_postfix_subexpr_t *nextnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i+1);
                if (nextnode->base.tag != NODE_CALL_EXPR) marray_push(uint32_t, self_list, dest_register);
            }

        } else if (tag == NODE_SUBSCRIPT_EXPR) {
            // process index
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
            visit(subnode->expr);
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
            uint32_t index = ircode_register_pop(code);
            if (index == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }

            // generate LOADAT/STOREAT instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }
			ircode_add(code, (is_real_assigment) ? STOREAT : LOADAT, dest_register, target_register, index, LINE_NUMBER(node));
            if ((!is_real_assigment) && (i+1<count)) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)subnode->expr, "Unexpected register error.");
                    return;
                }
                marray_push(uint32_t, self_list, rtemp);
            }
        }

        // reset is_super flag
        is_super = false;

        // update target
        target_register = dest_register;
    }

    marray_destroy(self_list);
    ircode_pop_context(code);

    // temp fix for not optimal register allocation algorithm generated code
    uint32_t temp_register = ircode_register_first_temp_available(code);
    if (temp_register < dest_register) {
        // free dest register
        ircode_register_pop(code);
        // allocate a new register (that I am now sure does not have holes)
        temp_register = ircode_register_push_temp(code);
        ircode_add(code, MOVE, temp_register, dest_register, 0, LINE_NUMBER(node));
        ircode_register_clear(code, dest_register);
    }
    
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);

    // re-enable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
}